

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detectionoutput.cpp
# Opt level: O2

int __thiscall
ncnn::DetectionOutput::forward
          (DetectionOutput *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  float fVar1;
  float fVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  int iVar7;
  pointer pMVar8;
  void *pvVar9;
  void *pvVar10;
  unsigned_long uVar11;
  Mat *this_00;
  pointer pvVar12;
  uint uVar13;
  long lVar14;
  float *pfVar15;
  size_type __n;
  pointer pfVar16;
  long lVar17;
  int *piVar18;
  size_type sVar19;
  int iVar20;
  ulong uVar21;
  size_type sVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  size_type __new_size;
  void *pvVar26;
  size_t j;
  float *pfVar27;
  long lVar28;
  int i;
  size_type sVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  vector<float,_std::allocator<float>_> bbox_scores;
  vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> bbox_rects;
  long local_180;
  vector<unsigned_long,_std::allocator<unsigned_long>_> picked;
  ulong local_140;
  vector<float,_std::allocator<float>_> class_bbox_scores;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  all_class_bbox_scores;
  vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
  all_class_bbox_rects;
  Mat bboxes;
  
  pMVar8 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  iVar7 = this->num_class;
  if (iVar7 == -0xe9) {
    uVar13 = pMVar8[2].h;
    local_180 = (long)(int)uVar13;
  }
  else {
    local_180 = 1;
    uVar13 = pMVar8[2].w / 4;
  }
  piVar18 = &this->num_class;
  if (iVar7 == -0xe9) {
    piVar18 = &pMVar8[1].h;
  }
  __new_size = (size_type)*piVar18;
  bboxes.elemsize._0_4_ = 0;
  bboxes.elemsize._4_4_ = 0;
  bboxes.elempack = 0;
  bboxes.data = (void *)0x0;
  bboxes.refcount._0_4_ = 0;
  bboxes.refcount._4_4_ = 0;
  bboxes.allocator = (Allocator *)0x0;
  bboxes.dims = 0;
  bboxes.w = 0;
  bboxes.h = 0;
  bboxes.c = 0;
  bboxes.cstep = 0;
  Mat::create(&bboxes,4,uVar13,4,opt->workspace_allocator);
  iVar20 = -100;
  if ((bboxes.data != (void *)0x0) && ((long)bboxes.c * bboxes.cstep != 0)) {
    uVar21 = 0;
    pvVar9 = pMVar8[2].data;
    if (iVar7 == -0xe9) {
      pvVar26 = (void *)0x0;
    }
    else {
      pvVar26 = (void *)((long)pMVar8[2].w * pMVar8[2].elemsize + (long)pvVar9);
    }
    pvVar10 = pMVar8->data;
    lVar14 = (long)bboxes.w;
    uVar23 = (ulong)uVar13;
    if ((int)uVar13 < 1) {
      uVar23 = uVar21;
    }
    lVar28 = CONCAT44(bboxes.elemsize._4_4_,(undefined4)bboxes.elemsize);
    pfVar27 = (float *)bboxes.data;
    for (; uVar23 * 0x10 != uVar21; uVar21 = uVar21 + 0x10) {
      pfVar15 = (float *)((long)pvVar26 + uVar21);
      if (pvVar26 == (void *)0x0) {
        pfVar15 = this->variances;
      }
      uVar3 = *(undefined8 *)pfVar15;
      uVar4 = *(undefined8 *)(pfVar15 + 2);
      uVar5 = *(undefined8 *)((long)pvVar10 + uVar21);
      uVar6 = *(undefined8 *)((long)pvVar10 + uVar21 + 8);
      fVar30 = expf((float)((ulong)uVar6 >> 0x20) * (float)((ulong)uVar4 >> 0x20));
      fVar31 = expf((float)uVar6 * (float)uVar4);
      pfVar15 = (float *)((long)pvVar9 + uVar21);
      fVar34 = pfVar15[2] - *pfVar15;
      fVar35 = pfVar15[3] - pfVar15[1];
      fVar32 = (*pfVar15 + pfVar15[2]) * 0.5 + fVar34 * (float)uVar5 * (float)uVar3;
      fVar33 = (pfVar15[1] + pfVar15[3]) * 0.5 +
               fVar35 * (float)((ulong)uVar5 >> 0x20) * (float)((ulong)uVar3 >> 0x20);
      fVar31 = fVar31 * fVar34 * 0.5;
      fVar30 = fVar30 * fVar35 * 0.5;
      *pfVar27 = fVar32 - fVar31;
      pfVar27[1] = fVar33 - fVar30;
      pfVar27[2] = fVar32 + fVar31;
      pfVar27[3] = fVar33 + fVar30;
      pfVar27 = (float *)((long)pfVar27 + lVar14 * lVar28);
    }
    all_class_bbox_rects.
    super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    all_class_bbox_rects.
    super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    all_class_bbox_rects.
    super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    all_class_bbox_scores.
    super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    all_class_bbox_scores.
    super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    all_class_bbox_scores.
    super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
    ::resize(&all_class_bbox_rects,__new_size);
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::resize(&all_class_bbox_scores,__new_size);
    sVar22 = 1;
    sVar29 = __new_size;
    if (iVar7 == -0xe9) {
      sVar29 = sVar22;
    }
    lVar14 = local_180 * 4;
    while( true ) {
      if ((long)__new_size <= (long)sVar22) break;
      bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      class_bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      class_bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      class_bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      lVar28 = lVar14;
      for (uVar21 = 0; uVar23 != uVar21; uVar21 = uVar21 + 1) {
        fVar30 = *(float *)((long)pMVar8[1].data + lVar28);
        picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT44(picked.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,fVar30);
        if (this->confidence_threshold <= fVar30 && fVar30 != this->confidence_threshold) {
          lVar17 = (long)bboxes.w * uVar21 *
                   CONCAT44(bboxes.elemsize._4_4_,(undefined4)bboxes.elemsize);
          bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)CONCAT44(*(undefined4 *)((long)bboxes.data + lVar17 + 4),
                                 *(undefined4 *)((long)bboxes.data + lVar17));
          bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
          super__Vector_impl_data._M_finish =
               (pointer)CONCAT44(*(undefined4 *)((long)bboxes.data + lVar17 + 0xc),
                                 *(undefined4 *)((long)bboxes.data + lVar17 + 8));
          bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)CONCAT44(bbox_rects.
                                 super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                                 (int)sVar22);
          std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::push_back
                    ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)&bbox_scores,
                     (value_type *)&bbox_rects);
          std::vector<float,_std::allocator<float>_>::push_back
                    (&class_bbox_scores,(value_type_conflict4 *)&picked);
        }
        lVar28 = lVar28 + sVar29 * 4;
      }
      qsort_descent_inplace<ncnn::BBoxRect>
                ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)&bbox_scores,
                 &class_bbox_scores);
      if (this->nms_top_k <
          (int)(((long)bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                (long)bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start) / 0x14)) {
        std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::resize
                  ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)&bbox_scores,
                   (long)this->nms_top_k);
        std::vector<float,_std::allocator<float>_>::resize(&class_bbox_scores,(long)this->nms_top_k)
        ;
      }
      picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      fVar30 = this->nms_threshold;
      __n = ((long)bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish -
            (long)bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start) / 0x14;
      std::vector<float,_std::allocator<float>_>::vector
                ((vector<float,_std::allocator<float>_> *)&bbox_rects,__n,
                 (allocator_type *)&local_140);
      pfVar16 = bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start + 2;
      for (sVar19 = 0; __n != sVar19; sVar19 = sVar19 + 1) {
        (&(bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
           super__Vector_impl_data._M_start)->xmin)[sVar19] =
             ((float)((ulong)*(undefined8 *)pfVar16 >> 0x20) -
             (float)((ulong)*(undefined8 *)(pfVar16 + -2) >> 0x20)) *
             ((float)*(undefined8 *)pfVar16 - (float)*(undefined8 *)(pfVar16 + -2));
        pfVar16 = pfVar16 + 5;
      }
      for (local_140 = 0; local_140 < __n; local_140 = local_140 + 1) {
        pfVar27 = bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start + local_140 * 5;
        uVar24 = (ulong)((long)picked.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)picked.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start) >> 3;
        uVar21 = uVar24 & 0xffffffff;
        if ((int)uVar24 < 1) {
          uVar21 = 0;
        }
        uVar24 = 1;
        for (uVar25 = 0; uVar21 != uVar25; uVar25 = uVar25 + 1) {
          uVar11 = picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar25];
          fVar31 = *pfVar27;
          fVar32 = bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar11 * 5 + 2];
          fVar33 = 0.0;
          if (fVar31 <= fVar32) {
            pfVar15 = bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start + uVar11 * 5;
            fVar34 = pfVar27[2];
            fVar35 = *pfVar15;
            if (fVar35 <= fVar34) {
              fVar1 = pfVar27[1];
              fVar36 = pfVar15[3];
              if (fVar1 <= fVar36) {
                fVar2 = pfVar27[3];
                fVar37 = pfVar15[1];
                if (fVar37 <= fVar2) {
                  if (fVar34 <= fVar32) {
                    fVar32 = fVar34;
                  }
                  if (fVar35 <= fVar31) {
                    fVar35 = fVar31;
                  }
                  if (fVar2 <= fVar36) {
                    fVar36 = fVar2;
                  }
                  if (fVar37 <= fVar1) {
                    fVar37 = fVar1;
                  }
                  fVar33 = (fVar36 - fVar37) * (fVar32 - fVar35);
                }
              }
            }
          }
          if (fVar30 < fVar33 / (((&(bbox_rects.
                                     super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->xmin)[local_140] -
                                 fVar33) +
                                (&(bbox_rects.
                                   super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->xmin)[uVar11])) {
            uVar24 = 0;
          }
        }
        if ((int)uVar24 != 0) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                    (&picked,(value_type_conflict5 *)&local_140);
        }
      }
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                ((_Vector_base<float,_std::allocator<float>_> *)&bbox_rects);
      for (uVar21 = 0;
          uVar21 < (ulong)((long)picked.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)picked.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start >> 3); uVar21 = uVar21 + 1
          ) {
        uVar11 = picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar21];
        std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::push_back
                  (all_class_bbox_rects.
                   super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + sVar22,
                   (value_type *)
                   (bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start + uVar11 * 5));
        std::vector<float,_std::allocator<float>_>::push_back
                  (all_class_bbox_scores.
                   super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + sVar22,
                   class_bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start + uVar11);
      }
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                (&picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                (&class_bbox_scores.super__Vector_base<float,_std::allocator<float>_>);
      std::_Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::~_Vector_base
                ((_Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)&bbox_scores);
      sVar22 = sVar22 + 1;
      lVar14 = lVar14 + local_180 * 4;
    }
    bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    lVar28 = 0x20;
    for (lVar14 = 1;
        pvVar12 = all_class_bbox_scores.
                  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start, lVar14 < (long)__new_size;
        lVar14 = lVar14 + 1) {
      std::vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>>::
      insert<__gnu_cxx::__normal_iterator<ncnn::BBoxRect_const*,std::vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>>>,void>
                ((vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>> *)&bbox_rects,
                 (const_iterator)
                 bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                 _M_impl.super__Vector_impl_data._M_finish,
                 *(BBoxRect **)
                  ((long)all_class_bbox_rects.
                         super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar28 + -8),
                 *(BBoxRect **)
                  ((long)&((all_class_bbox_rects.
                            super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>).
                          _M_impl.super__Vector_impl_data._M_start + lVar28));
      std::vector<float,std::allocator<float>>::
      insert<__gnu_cxx::__normal_iterator<float_const*,std::vector<float,std::allocator<float>>>,void>
                ((vector<float,std::allocator<float>> *)&bbox_scores,
                 (const_iterator)
                 bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish,
                 (__normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_>)
                 *(float **)((long)pvVar12 + lVar28 + -8),
                 (__normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_>)
                 *(float **)
                  ((long)&(pvVar12->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                          super__Vector_impl_data._M_start + lVar28));
      lVar28 = lVar28 + 0x18;
    }
    qsort_descent_inplace<ncnn::BBoxRect>(&bbox_rects,&bbox_scores);
    uVar13 = (uint)(((long)bbox_rects.
                           super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)bbox_rects.
                          super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                          _M_impl.super__Vector_impl_data._M_start) / 0x14);
    if (this->keep_top_k < (int)uVar13) {
      std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::resize
                (&bbox_rects,(long)this->keep_top_k);
      std::vector<float,_std::allocator<float>_>::resize(&bbox_scores,(long)this->keep_top_k);
      uVar13 = (uint)(((long)bbox_rects.
                             super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)bbox_rects.
                            super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                            _M_impl.super__Vector_impl_data._M_start) / 0x14);
    }
    if (uVar13 == 0) {
      iVar20 = 0;
    }
    else {
      this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      Mat::create(this_00,6,uVar13,4,opt->blob_allocator);
      pvVar9 = this_00->data;
      iVar20 = -100;
      if ((pvVar9 != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
        iVar20 = 0;
        uVar21 = (ulong)uVar13;
        if ((int)uVar13 < 1) {
          uVar21 = 0;
        }
        piVar18 = &(bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                    _M_impl.super__Vector_impl_data._M_start)->label;
        for (uVar23 = 0; uVar21 != uVar23; uVar23 = uVar23 + 1) {
          lVar14 = (long)(int)uVar23 * (long)this_00->w * this_00->elemsize;
          fVar30 = bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar23];
          *(float *)((long)pvVar9 + lVar14) = (float)*piVar18;
          *(float *)((long)pvVar9 + lVar14 + 4) = fVar30;
          *(float *)((long)pvVar9 + lVar14 + 8) = ((BBoxRect *)(piVar18 + -4))->xmin;
          *(int *)((long)pvVar9 + lVar14 + 0xc) = piVar18[-3];
          *(int *)((long)pvVar9 + lVar14 + 0x10) = piVar18[-2];
          *(int *)((long)pvVar9 + lVar14 + 0x14) = piVar18[-1];
          piVar18 = piVar18 + 5;
        }
      }
    }
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              (&bbox_scores.super__Vector_base<float,_std::allocator<float>_>);
    std::_Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::~_Vector_base
              (&bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>);
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::~vector(&all_class_bbox_scores);
    std::
    vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
    ::~vector(&all_class_bbox_rects);
  }
  Mat::~Mat(&bboxes);
  return iVar20;
}

Assistant:

int DetectionOutput::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& location = bottom_blobs[0];
    const Mat& confidence = bottom_blobs[1];
    const Mat& priorbox = bottom_blobs[2];

    bool mxnet_ssd_style = num_class == -233;

    // mxnet-ssd _contrib_MultiBoxDetection
    const int num_prior = mxnet_ssd_style ? priorbox.h : priorbox.w / 4;

    int num_class_copy = mxnet_ssd_style ? confidence.h : num_class;

    // apply location with priorbox
    Mat bboxes;
    bboxes.create(4, num_prior, 4u, opt.workspace_allocator);
    if (bboxes.empty())
        return -100;

    const float* location_ptr = location;
    const float* priorbox_ptr = priorbox.row(0);
    const float* variance_ptr = mxnet_ssd_style ? 0 : priorbox.row(1);

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int i = 0; i < num_prior; i++)
    {
        const float* loc = location_ptr + i * 4;
        const float* pb = priorbox_ptr + i * 4;
        const float* var = variance_ptr ? variance_ptr + i * 4 : variances;

        float* bbox = bboxes.row(i);

        // CENTER_SIZE
        float pb_w = pb[2] - pb[0];
        float pb_h = pb[3] - pb[1];
        float pb_cx = (pb[0] + pb[2]) * 0.5f;
        float pb_cy = (pb[1] + pb[3]) * 0.5f;

        float bbox_cx = var[0] * loc[0] * pb_w + pb_cx;
        float bbox_cy = var[1] * loc[1] * pb_h + pb_cy;
        float bbox_w = static_cast<float>(exp(var[2] * loc[2]) * pb_w);
        float bbox_h = static_cast<float>(exp(var[3] * loc[3]) * pb_h);

        bbox[0] = bbox_cx - bbox_w * 0.5f;
        bbox[1] = bbox_cy - bbox_h * 0.5f;
        bbox[2] = bbox_cx + bbox_w * 0.5f;
        bbox[3] = bbox_cy + bbox_h * 0.5f;
    }

    // sort and nms for each class
    std::vector< std::vector<BBoxRect> > all_class_bbox_rects;
    std::vector< std::vector<float> > all_class_bbox_scores;
    all_class_bbox_rects.resize(num_class_copy);
    all_class_bbox_scores.resize(num_class_copy);

    // start from 1 to ignore background class
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int i = 1; i < num_class_copy; i++)
    {
        // filter by confidence_threshold
        std::vector<BBoxRect> class_bbox_rects;
        std::vector<float> class_bbox_scores;

        for (int j = 0; j < num_prior; j++)
        {
            // prob data layout
            // caffe-ssd = num_class x num_prior
            // mxnet-ssd = num_prior x num_class
            float score = mxnet_ssd_style ? confidence[i * num_prior + j] : confidence[j * num_class_copy + i];

            if (score > confidence_threshold)
            {
                const float* bbox = bboxes.row(j);
                BBoxRect c = { bbox[0], bbox[1], bbox[2], bbox[3], i };
                class_bbox_rects.push_back(c);
                class_bbox_scores.push_back(score);
            }
        }

        // sort inplace
        qsort_descent_inplace(class_bbox_rects, class_bbox_scores);

        // keep nms_top_k
        if (nms_top_k < (int)class_bbox_rects.size())
        {
            class_bbox_rects.resize(nms_top_k);
            class_bbox_scores.resize(nms_top_k);
        }

        // apply nms
        std::vector<size_t> picked;
        nms_sorted_bboxes(class_bbox_rects, picked, nms_threshold);

        // select
        for (size_t j = 0; j < picked.size(); j++)
        {
            size_t z = picked[j];
            all_class_bbox_rects[i].push_back(class_bbox_rects[z]);
            all_class_bbox_scores[i].push_back(class_bbox_scores[z]);
        }
    }

    // gather all class
    std::vector<BBoxRect> bbox_rects;
    std::vector<float> bbox_scores;

    for (int i = 1; i < num_class_copy; i++)
    {
        const std::vector<BBoxRect>& class_bbox_rects = all_class_bbox_rects[i];
        const std::vector<float>& class_bbox_scores = all_class_bbox_scores[i];

        bbox_rects.insert(bbox_rects.end(), class_bbox_rects.begin(), class_bbox_rects.end());
        bbox_scores.insert(bbox_scores.end(), class_bbox_scores.begin(), class_bbox_scores.end());
    }

    // global sort inplace
    qsort_descent_inplace(bbox_rects, bbox_scores);

    // keep_top_k
    if (keep_top_k < (int)bbox_rects.size())
    {
        bbox_rects.resize(keep_top_k);
        bbox_scores.resize(keep_top_k);
    }

    // fill result
    int num_detected = static_cast<int>(bbox_rects.size());
    if (num_detected == 0)
        return 0;

    Mat& top_blob = top_blobs[0];
    top_blob.create(6, num_detected, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    for (int i = 0; i < num_detected; i++)
    {
        const BBoxRect& r = bbox_rects[i];
        float score = bbox_scores[i];
        float* outptr = top_blob.row(i);

        outptr[0] = static_cast<float>(r.label);
        outptr[1] = score;
        outptr[2] = r.xmin;
        outptr[3] = r.ymin;
        outptr[4] = r.xmax;
        outptr[5] = r.ymax;
    }

    return 0;
}